

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O2

SeqEntry * __thiscall
ECdecoding::checkCandidate
          (SeqEntry *__return_storage_ptr__,ECdecoding *this,SeqEntry *can,unsigned_long threshold)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  SeqEntry *bestCan;
  
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back(&this->candidates,can);
  pSVar1 = (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar2 = (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)pSVar1 - (long)pSVar2;
  if (threshold < (ulong)(lVar3 / 0x260)) {
    can = (SeqEntry *)
          std::
          __min_element<__gnu_cxx::__normal_iterator<SeqEntry*,std::vector<SeqEntry,std::allocator<SeqEntry>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pSVar2,pSVar1,lVar3 % 0x260);
  }
  else {
    this->endFailed = true;
  }
  SeqEntry::SeqEntry(__return_storage_ptr__,can);
  return __return_storage_ptr__;
}

Assistant:

SeqEntry ECdecoding::checkCandidate(SeqEntry &can, unsigned long threshold) {
    candidates.push_back(can);
    if (candidates.size() > threshold) {
        SeqEntry bestCan = *min_element(candidates.begin(), candidates.end());
        DEBUG("Final candidate: " << bestCan.seq);
        return bestCan;
    } else {
        endFailed = true;
        return can;
    }
}